

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O3

void __thiscall VectorLattice_GetBottom_Test::TestBody(VectorLattice_GetBottom_Test *this)

{
  char *message;
  initializer_list<bool> __l;
  undefined1 local_88 [8];
  Vector<wasm::analysis::Bool> vector;
  long local_58;
  vector<bool,_std::allocator<bool>_> local_50;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  bool local_13 [2];
  allocator_type local_11;
  
  vector._0_8_ = 2;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::getBottom
            ((Element *)&vector.size,(Vector<wasm::analysis::Bool> *)local_88);
  local_13[0] = false;
  local_13[1] = false;
  __l._M_len = 2;
  __l._M_array = local_13;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_50,__l,&local_11);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            (local_28,"vector.getBottom()","(std::vector<bool>{false, false})",
             (vector<bool,_std::allocator<bool>_> *)&vector.size,&local_50);
  if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (vector.size != 0) {
    operator_delete((void *)vector.size,local_58 - vector.size);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&vector.size);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1c7,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&vector.size);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (vector.size != 0) {
      (**(code **)(*(long *)vector.size + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST(VectorLattice, GetBottom) {
  analysis::Vector<analysis::Bool> vector{analysis::Bool{}, 2};
  EXPECT_EQ(vector.getBottom(), (std::vector<bool>{false, false}));
}